

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall google::protobuf::internal::UntypedMapIterator::PlusPlus(UntypedMapIterator *this)

{
  NodeBase *pNVar1;
  NodeBase *node;
  map_index_t i;
  UntypedMapIterator *this_local;
  
  if (this->node_->next == (NodeBase *)0x0) {
    node._4_4_ = this->bucket_index_;
    do {
      node._4_4_ = node._4_4_ + 1;
      if (this->m_->num_buckets_ <= node._4_4_) {
        this->node_ = (NodeBase *)0x0;
        this->bucket_index_ = 0;
        return;
      }
      pNVar1 = this->m_->table_[node._4_4_];
    } while (pNVar1 == (NodeBase *)0x0);
    this->node_ = pNVar1;
    this->bucket_index_ = node._4_4_;
  }
  else {
    this->node_ = this->node_->next;
  }
  return;
}

Assistant:

inline void UntypedMapIterator::PlusPlus() {
  if (node_->next != nullptr) {
    node_ = node_->next;
    return;
  }

  for (map_index_t i = bucket_index_ + 1; i < m_->num_buckets_; ++i) {
    NodeBase* node = m_->table_[i];
    if (node == nullptr) continue;
    node_ = node;
    bucket_index_ = i;
    return;
  }

  node_ = nullptr;
  bucket_index_ = 0;
}